

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

void ThreadPool::_workerThread(ThreadPool *pool,size_t threadId)

{
  anon_class_16_2_8a85c942 __p;
  bool bVar1;
  __int_type _Var2;
  reference pvVar3;
  reference ppAVar4;
  size_type in_RSI;
  long in_RDI;
  AbstractTaskProvider *task;
  unique_lock<std::mutex> _mutexLock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffa8;
  mutex *in_stack_ffffffffffffffb0;
  unique_lock<std::mutex> *this;
  value_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 skip;
  AbstractTaskProvider *in_stack_ffffffffffffffe0;
  size_type local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  _Var2 = std::__atomic_base<unsigned_long>::operator++
                    ((__atomic_base<unsigned_long> *)(in_RDI + 0xa0));
  if (_Var2 == *(__int_type *)(local_8 + 0xd8)) {
    std::mutex::lock(in_stack_ffffffffffffffb0);
    *(undefined1 *)(local_8 + 0xe0) = 1;
    std::condition_variable::notify_one();
    std::mutex::unlock((mutex *)0x13be16);
  }
  while (pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             (local_8 + 0x30),local_10), *pvVar3 == '\0') {
    this = (unique_lock<std::mutex> *)&stack0xffffffffffffffe0;
    std::unique_lock<std::mutex>::unique_lock(this,(mutex_type *)in_stack_ffffffffffffffa8);
    skip = (undefined1)((ulong)&local_10 >> 0x38);
    __p.threadId._0_4_ = in_stack_ffffffffffffffc0;
    __p.pool = (ThreadPool **)in_stack_ffffffffffffffb8;
    __p.threadId._4_4_ = in_stack_ffffffffffffffc4;
    std::condition_variable::wait<ThreadPool::_workerThread(ThreadPool*,unsigned_long)::__0>
              ((condition_variable *)this,in_stack_ffffffffffffffa8,__p);
    std::unique_lock<std::mutex>::unlock(this);
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_8 + 0x30),
                        local_10);
    if (*pvVar3 == '\0') {
      std::mutex::lock((mutex *)this);
      bVar1 = std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::
              empty((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)
                    (local_8 + 0xe8));
      if (bVar1) {
        pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                            (local_8 + 0x18),local_10);
        *pvVar3 = '\0';
        std::mutex::unlock((mutex *)0x13bf74);
      }
      else {
        ppAVar4 = std::__cxx11::
                  list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::front
                            ((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>
                              *)this);
        in_stack_ffffffffffffffb8 = *ppAVar4;
        std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::
        pop_front((list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_> *)this);
        std::mutex::unlock((mutex *)0x13bf3b);
        AbstractTaskProvider::_taskRun(in_stack_ffffffffffffffe0,(bool)skip);
      }
      iVar5 = 0;
    }
    else {
      iVar5 = 3;
    }
    std::unique_lock<std::mutex>::~unique_lock(this);
    if (iVar5 != 0) break;
    in_stack_ffffffffffffffc0 = 0;
  }
  std::__atomic_base<unsigned_long>::operator--((__atomic_base<unsigned_long> *)(local_8 + 0xa0));
  return;
}

Assistant:

void ThreadPool::_workerThread( ThreadPool * pool, size_t threadId )
{
    if( ++(pool->_runningThreadCount) == pool->_threadCount ) {
        pool->_creation.lock();
        pool->_threadsCreated = true;
        pool->_completeCreation.notify_one();
        pool->_creation.unlock();
    }

    while( !pool->_exit[threadId] ) {
        std::unique_lock < std::mutex > _mutexLock( pool->_taskInfo );
        pool->_waiting.wait( _mutexLock, [&] { return pool->_run[threadId]; } );
        _mutexLock.unlock();

        if( pool->_exit[threadId] )
            break;

        pool->_taskInfo.lock();

        if( !pool->_task.empty() ) {
            AbstractTaskProvider * task = pool->_task.front();

            pool->_task.pop_front();

            pool->_taskInfo.unlock();

            task->_taskRun( false );
        }
        else {
            pool->_run[threadId] = 0;

            pool->_taskInfo.unlock();
        }
    }

    --(pool->_runningThreadCount);
}